

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlocaltime.cpp
# Opt level: O0

bool anon_unknown.dwarf_362fcb::preferAlternative
               (TransitionOptions resolve,int gotDst,int altDst,bool altIsLater,bool inGap)

{
  long lVar1;
  bool bVar2;
  bool bVar3;
  undefined4 uVar4;
  byte in_CL;
  uint in_EDX;
  uint in_ESI;
  byte in_R8B;
  long in_FS_OFFSET;
  bool isReversed;
  TransitionOption preferLater;
  TransitionOption in_stack_ffffffffffffffdc;
  undefined2 in_stack_ffffffffffffffe0;
  undefined1 in_stack_ffffffffffffffe2;
  undefined1 in_stack_ffffffffffffffe3;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  bVar2 = (bool)(in_R8B & 1);
  uVar4 = 0x40;
  if (bVar2 != false) {
    uVar4 = 4;
  }
  bVar3 = QFlags<QDateTimePrivate::TransitionOption>::testFlag
                    ((QFlags<QDateTimePrivate::TransitionOption> *)
                     CONCAT44(uVar4,CONCAT13(in_stack_ffffffffffffffe3,
                                             CONCAT12(in_stack_ffffffffffffffe2,
                                                      in_stack_ffffffffffffffe0))),
                     in_stack_ffffffffffffffdc);
  if ((((bVar3) && ((in_EDX ^ in_ESI) == 1)) &&
      (in_stack_ffffffffffffffe3 = (in_EDX == 1) != ((bool)(in_CL & 1) == bVar2),
      (bool)in_stack_ffffffffffffffe3)) && (uVar4 = 0x20, bVar2 != false)) {
    uVar4 = 2;
  }
  bVar2 = QFlags<QDateTimePrivate::TransitionOption>::testFlag
                    ((QFlags<QDateTimePrivate::TransitionOption> *)
                     CONCAT44(uVar4,CONCAT13(in_stack_ffffffffffffffe3,
                                             CONCAT12(in_stack_ffffffffffffffe2,
                                                      in_stack_ffffffffffffffe0))),
                     in_stack_ffffffffffffffdc);
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return bVar2 == (bool)(in_CL & 1);
}

Assistant:

Q_DECL_COLD_FUNCTION
bool preferAlternative(QDateTimePrivate::TransitionOptions resolve,
                       // is_dst flags of incumbent and an alternative:
                       int gotDst, int altDst,
                       // True precisely if alternative selects a later UTC time:
                       bool altIsLater,
                       // True for a gap, false for a fold:
                       bool inGap)
{
    // If resolve has this option set, prefer the later candidate, else the earlier:
    QDateTimePrivate::TransitionOption preferLater = inGap ? QDateTimePrivate::GapUseAfter
                                                           : QDateTimePrivate::FoldUseAfter;
    if (resolve.testFlag(QDateTimePrivate::FlipForReverseDst)) {
        // gotDst and altDst are {-1: unknown, 0: standard, 1: daylight-saving}
        // So gotDst ^ altDst is 1 precisely if exactly one candidate thinks it's DST.
        if ((altDst ^ gotDst) == 1) {
            // In this case, we can tell whether we have reversed DST: that's a
            // gap with DST before it or a fold with DST after it.
#if 1
            const bool isReversed = (altDst == 1) != (altIsLater == inGap);
#else // Pedagogic version of the same thing:
            bool isReversed;
            if (altIsLater == inGap) // alt is after a gap or before a fold, so summer-time
                isReversed = altDst != 1; // flip if summer-time isn't DST
            else // alt is before a gap or after a fold, so winter-time
                isReversed = altDst == 1; // flip if winter-time is DST
#endif
            if (isReversed) {
                preferLater = inGap ? QDateTimePrivate::GapUseBefore
                                    : QDateTimePrivate::FoldUseBefore;
            }
        } // Otherwise, we can't tell, so assume not.
    }
    return resolve.testFlag(preferLater) == altIsLater;
}